

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_crc32.c
# Opt level: O3

uint32_t calculate_crc32c(uint32_t crc32c,uchar *buffer,uint length)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  long lVar7;
  uint uVar8;
  
  uVar2 = (ulong)crc32c;
  if (3 < length) {
    uVar3 = (uint)buffer & 3;
    uVar8 = 4 - uVar3;
    uVar4 = length - uVar8;
    lVar7 = 0;
    do {
      uVar1 = (uint)(uVar2 >> 8) ^ crc32Table[(byte)(buffer[lVar7] ^ (byte)uVar2)];
      uVar2 = (ulong)uVar1;
      lVar7 = lVar7 + 1;
    } while (4 - uVar3 != (int)lVar7);
    puVar6 = (uint *)(buffer + uVar8);
    if (7 < uVar4) {
      uVar3 = uVar4 >> 3;
      do {
        uVar1 = (uint)uVar2 ^ *puVar6;
        uVar8 = puVar6[1];
        uVar1 = sctp_crc_tableil8_o80[uVar1 >> 8 & 0xff] ^ sctp_crc_tableil8_o88[uVar1 & 0xff] ^
                *(uint *)((long)sctp_crc_tableil8_o72 + (ulong)(uVar1 >> 0xe & 0x3fc)) ^
                sctp_crc_tableil8_o64[uVar1 >> 0x18] ^ sctp_crc_tableil8_o56[uVar8 & 0xff] ^
                sctp_crc_tableil8_o48[uVar8 >> 8 & 0xff] ^
                *(uint *)((long)sctp_crc_tableil8_o40 + (ulong)(uVar8 >> 0xe & 0x3fc)) ^
                crc32Table[uVar8 >> 0x18];
        puVar6 = puVar6 + 2;
        uVar2 = (ulong)uVar1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    if ((uVar4 & 7) != 0) {
      lVar7 = 0;
      do {
        uVar1 = uVar1 >> 8 ^ crc32Table[(byte)(*(byte *)((long)puVar6 + lVar7) ^ (byte)uVar1)];
        lVar7 = lVar7 + 1;
      } while (((byte)((char)length + ((byte)buffer & 3) + 4) & 7) != (uint)lVar7);
    }
    return uVar1;
  }
  if (length != 0) {
    uVar5 = 0;
    do {
      crc32c = (uint)(uVar2 >> 8) ^ crc32Table[(byte)(buffer[uVar5] ^ (byte)uVar2)];
      uVar2 = (ulong)crc32c;
      uVar5 = uVar5 + 1;
    } while (length != uVar5);
  }
  return crc32c;
}

Assistant:

uint32_t calculate_crc32c(uint32_t crc32c, const unsigned char *buffer,
			  unsigned int length)
{
	if (length < 4)
		return (singletable_crc32c(crc32c, buffer, length));
	else
		return (multitable_crc32c(crc32c, buffer, length));
}